

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O3

diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
 __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
::
visit_node<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
          (traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
           *this,index_pointer node,uint shifts,
          diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          out)

{
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  dVar1;
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  local_10;
  
  local_10.p_.ptr_ = out.p_.ptr_;
  if (((ulong)node.internal_ & 1) != 0) {
    if (shifts < 0x42) {
      dVar1 = visit_intermediate<pstore::index::details::internal_node,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                        (this,node,shifts,out);
      return (diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
              )dVar1.p_.ptr_;
    }
    dVar1 = visit_intermediate<pstore::index::details::linear_node,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
                      (this,node,shifts,out);
    return (diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
            )dVar1.p_.ptr_;
  }
  if (((ulong)node.internal_ & 2) == 0) {
    if (*(internal_node **)(this + 0x10) <= node.internal_) {
      diff_dump::details::
      diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::operator=(&local_10,node.addr_.a_);
      out = local_10;
    }
    return (not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
            )out.p_.ptr_;
  }
  assert_failed("node.is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                ,0x62);
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }